

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PathRect(ImDrawList *this,ImVec2 *a,ImVec2 *b,float rounding,ImDrawFlags flags)

{
  uint uVar1;
  uint uVar2;
  ImVector<ImVec2> *this_00;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImVec2 local_58;
  float local_50;
  float local_4c;
  undefined1 local_48 [16];
  
  local_48._0_4_ = rounding;
  uVar1 = FixRectCornerFlags(flags);
  uVar2 = ~uVar1;
  fVar6 = 0.5;
  if ((uVar2 & 0xc0) != 0) {
    fVar6 = 1.0;
  }
  fVar7 = 0.5;
  if ((uVar2 & 0x30) != 0) {
    fVar7 = fVar6;
  }
  fVar6 = 0.5;
  if ((uVar2 & 0xa0) != 0) {
    fVar6 = 1.0;
  }
  fVar3 = 0.5;
  if ((uVar2 & 0x50) != 0) {
    fVar3 = fVar6;
  }
  if ((uVar1 & 0x1f0) != 0x100) {
    fVar4 = (*a).x;
    fVar5 = (*a).y;
    fVar7 = ABS(b->x - fVar4) * fVar7 + -1.0;
    fVar6 = (float)local_48._0_4_;
    if (fVar7 <= (float)local_48._0_4_) {
      fVar6 = fVar7;
    }
    fVar7 = ABS(b->y - fVar5) * fVar3 + -1.0;
    if (fVar7 <= fVar6) {
      fVar6 = fVar7;
    }
    if (0.0 < fVar6) {
      fVar7 = 0.0;
      if ((uVar1 & 0x10) != 0) {
        fVar7 = fVar6;
      }
      local_50 = 0.0;
      if ((uVar1 & 0x20) != 0) {
        local_50 = fVar6;
      }
      fVar3 = 0.0;
      if ((char)uVar1 < '\0') {
        fVar3 = fVar6;
      }
      local_48 = ZEXT416((uint)fVar3);
      local_4c = 0.0;
      if ((uVar1 & 0x40) != 0) {
        local_4c = fVar6;
      }
      local_58.x = fVar4 + fVar7;
      local_58.y = fVar5 + fVar7;
      PathArcToFast(this,&local_58,fVar7,6,9);
      local_58.y = a->y + local_50;
      local_58.x = b->x - local_50;
      PathArcToFast(this,&local_58,local_50,9,0xc);
      local_58.x = (*b).x - (float)local_48._0_4_;
      local_58.y = (*b).y - (float)local_48._0_4_;
      PathArcToFast(this,&local_58,(float)local_48._0_4_,0,3);
      local_58.y = b->y - local_4c;
      local_58.x = a->x + local_4c;
      PathArcToFast(this,&local_58,local_4c,3,6);
      return;
    }
  }
  this_00 = &this->_Path;
  ImVector<ImVec2>::push_back(this_00,a);
  local_58.y = a->y;
  local_58.x = b->x;
  ImVector<ImVec2>::push_back(this_00,&local_58);
  ImVector<ImVec2>::push_back(this_00,b);
  local_58.y = b->y;
  local_58.x = a->x;
  ImVector<ImVec2>::push_back(this_00,&local_58);
  return;
}

Assistant:

void ImDrawList::PathRect(const ImVec2& a, const ImVec2& b, float rounding, ImDrawFlags flags)
{
    flags = FixRectCornerFlags(flags);
    rounding = ImMin(rounding, ImFabs(b.x - a.x) * ( ((flags & ImDrawFlags_RoundCornersTop)  == ImDrawFlags_RoundCornersTop)  || ((flags & ImDrawFlags_RoundCornersBottom) == ImDrawFlags_RoundCornersBottom) ? 0.5f : 1.0f ) - 1.0f);
    rounding = ImMin(rounding, ImFabs(b.y - a.y) * ( ((flags & ImDrawFlags_RoundCornersLeft) == ImDrawFlags_RoundCornersLeft) || ((flags & ImDrawFlags_RoundCornersRight)  == ImDrawFlags_RoundCornersRight)  ? 0.5f : 1.0f ) - 1.0f);

    if (rounding <= 0.0f || (flags & ImDrawFlags_RoundCornersMask_) == ImDrawFlags_RoundCornersNone)
    {
        PathLineTo(a);
        PathLineTo(ImVec2(b.x, a.y));
        PathLineTo(b);
        PathLineTo(ImVec2(a.x, b.y));
    }
    else
    {
        const float rounding_tl = (flags & ImDrawFlags_RoundCornersTopLeft)     ? rounding : 0.0f;
        const float rounding_tr = (flags & ImDrawFlags_RoundCornersTopRight)    ? rounding : 0.0f;
        const float rounding_br = (flags & ImDrawFlags_RoundCornersBottomRight) ? rounding : 0.0f;
        const float rounding_bl = (flags & ImDrawFlags_RoundCornersBottomLeft)  ? rounding : 0.0f;
        PathArcToFast(ImVec2(a.x + rounding_tl, a.y + rounding_tl), rounding_tl, 6, 9);
        PathArcToFast(ImVec2(b.x - rounding_tr, a.y + rounding_tr), rounding_tr, 9, 12);
        PathArcToFast(ImVec2(b.x - rounding_br, b.y - rounding_br), rounding_br, 0, 3);
        PathArcToFast(ImVec2(a.x + rounding_bl, b.y - rounding_bl), rounding_bl, 3, 6);
    }
}